

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O2

bool __thiscall search::BSTNode::erase(BSTNode *this,int key,Record **r)

{
  int key_00;
  BSTNode *this_00;
  BSTNode *pBVar1;
  BSTNode *pBVar2;
  Record *r1;
  
  this_00 = search(this,key);
  if (this_00 != (BSTNode *)0x0) {
    *r = this_00->record_;
    pBVar1 = this_00->left_;
    pBVar2 = this_00->right_;
    if (pBVar1 == (BSTNode *)0x0) {
      pBVar1 = this_00->parent_;
      if (pBVar2 == (BSTNode *)0x0) {
        (&pBVar1->left_)[pBVar1->key_ < this_00->key_] = (BSTNode *)0x0;
      }
      else {
        if (pBVar1->key_ < this_00->key_) {
          pBVar1->right_ = pBVar2;
          pBVar2 = this_00->right_;
        }
        else {
          pBVar1->left_ = pBVar2;
        }
        pBVar2->parent_ = pBVar1;
      }
    }
    else {
      if (pBVar2 != (BSTNode *)0x0) {
        pBVar1 = successor(this_00);
        r1 = (Record *)0x0;
        key_00 = pBVar1->key_;
        erase(this_00,key_00,&r1);
        this_00->key_ = key_00;
        this_00->record_ = r1;
        goto LAB_00106261;
      }
      pBVar2 = this_00->parent_;
      if (pBVar2->key_ < this_00->key_) {
        pBVar2->right_ = pBVar1;
      }
      else {
        pBVar2->left_ = pBVar1;
        pBVar1 = this_00->left_;
      }
      pBVar1->parent_ = pBVar2;
    }
    operator_delete(this_00,0x28);
  }
LAB_00106261:
  return this_00 != (BSTNode *)0x0;
}

Assistant:

bool BSTNode::erase(int key, Record*& r)
    {
        BSTNode* nd = search(key);
        if (!nd)
            return false;
        r = nd->record_;
        if (!nd->left_ && !nd->right_)
        {

            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nullptr;
            else
                nd->parent_->left_ = nullptr;
            delete nd;
        }
        else if (!nd->left_ && nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->right_;
            else
                nd->parent_->left_ = nd->right_;
            nd->right_->parent_ = nd->parent_;
            delete nd;
        }
        else if (nd->left_ && !nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->left_;
            else
                nd->parent_->left_ = nd->left_;
            nd->left_->parent_ = nd->parent_;
            delete nd;
        }
        else
        {
            auto su = nd->successor();
            Record* r1 = nullptr;
            int kk = su->key_;
            nd->erase(su->key_, r1);
            nd->key_ = kk;
            nd->record_ = r1;
        }
        return true;
    }